

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.h
# Opt level: O3

void __thiscall HEkk::HEkk(HEkk *this)

{
  this->callback_ = (HighsCallback *)0x0;
  this->options_ = (HighsOptions *)0x0;
  this->timer_ = (HighsTimer *)0x0;
  HighsSimplexAnalysis::HighsSimplexAnalysis(&this->analysis_);
  HighsLp::HighsLp(&this->lp_);
  (this->lp_name_)._M_dataplus._M_p = (pointer)&(this->lp_name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->lp_name_);
  (this->status_).has_ar_matrix = false;
  (this->status_).has_nla = false;
  (this->status_).has_dual_steepest_edge_weights = false;
  (this->status_).has_invert = false;
  (this->status_).has_fresh_invert = false;
  (this->status_).has_fresh_rebuild = false;
  (this->status_).has_dual_objective_value = false;
  (this->status_).has_primal_objective_value = false;
  (this->status_).initialised_for_new_lp = false;
  (this->status_).is_dualized = false;
  (this->status_).is_permuted = false;
  (this->status_).initialised_for_solve = false;
  (this->status_).has_basis = false;
  (this->status_).has_ar_matrix = false;
  (this->status_).has_nla = false;
  (this->status_).has_dual_steepest_edge_weights = false;
  (this->info_).backtracking_basis_.basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info_).backtracking_basis_.basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info_).backtracking_basis_.basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info_).backtracking_basis_.nonbasicFlag_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->info_).backtracking_basis_.nonbasicFlag_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->info_).backtracking_basis_.nonbasicFlag_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->info_).backtracking_basis_.nonbasicMove_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->info_).backtracking_basis_.nonbasicMove_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->info_).backtracking_basis_.nonbasicMove_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  memset(&this->info_,0,0x1ba);
  (this->info_).backtracking_basis_.debug_id = -1;
  (this->info_).backtracking_basis_.debug_update_count = -1;
  (this->info_).backtracking_basis_.debug_origin_name._M_dataplus._M_p =
       (pointer)&(this->info_).backtracking_basis_.debug_origin_name.field_2;
  (this->info_).backtracking_basis_.debug_origin_name._M_string_length = 0;
  (this->info_).backtracking_basis_.debug_origin_name.field_2._M_local_buf[0] = '\0';
  (this->info_).backtracking_basis_workShift_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info_).backtracking_basis_workShift_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info_).backtracking_basis_workShift_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info_).backtracking_basis_workLowerShift_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->info_).backtracking_basis_workLowerShift_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->info_).backtracking_basis_workLowerShift_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->info_).backtracking_basis_workUpperShift_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->info_).backtracking_basis_workUpperShift_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->info_).backtracking_basis_workUpperShift_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->info_).backtracking_basis_edge_weight_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info_).backtracking_basis_edge_weight_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info_).backtracking_basis_edge_weight_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info_).primal_simplex_phase1_cost_perturbation_multiplier = 1.0;
  (this->info_).run_quiet = false;
  (this->info_).store_squared_primal_infeasibility = false;
  (this->info_).report_simplex_inner_clock = false;
  (this->info_).report_simplex_outer_clock = false;
  (this->info_).report_simplex_phases_clock = false;
  (this->info_).report_HFactor_clock = false;
  (this->info_).analyse_lp = false;
  (this->info_).analyse_iterations = false;
  (this->info_).analyse_invert_form = false;
  (this->info_).allow_cost_shifting = true;
  (this->info_).allow_cost_perturbation = true;
  (this->info_).allow_bound_perturbation = true;
  (this->info_).costs_shifted = false;
  (this->info_).costs_perturbed = false;
  (this->info_).bounds_perturbed = false;
  (this->info_).num_primal_infeasibilities = -1;
  (this->info_).num_dual_infeasibilities = -1;
  (this->info_).dual_phase2_iteration_count0 = 0;
  (this->info_).primal_phase1_iteration_count0 = 0;
  (this->info_).primal_phase2_iteration_count0 = 0;
  (this->info_).primal_bound_swap0 = 0;
  (this->info_).primal_bound_swap = 0;
  (this->info_).iteration_count0 = 0;
  (this->info_).dual_phase1_iteration_count0 = 0;
  (this->info_).dual_phase2_iteration_count0 = 0;
  (this->info_).dual_phase1_iteration_count = 0;
  (this->info_).dual_phase2_iteration_count = 0;
  (this->info_).primal_phase1_iteration_count = 0;
  (this->info_).primal_phase2_iteration_count = 0;
  (this->info_).min_concurrency = 1;
  (this->info_).num_concurrency = 1;
  (this->info_).max_concurrency = 8;
  (this->info_).multi_iteration = 0;
  this->model_status_ = kMin;
  (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->basis_).debug_id = -1;
  (this->basis_).debug_update_count = -1;
  (this->basis_).debug_origin_name._M_dataplus._M_p =
       (pointer)&(this->basis_).debug_origin_name.field_2;
  (this->basis_).debug_origin_name._M_string_length = 0;
  (this->basis_).debug_origin_name.field_2._M_local_buf[0] = '\0';
  HighsHashTable<unsigned_long,_void>::HighsHashTable(&this->visited_basis_);
  (this->random_).state = 0x9eefcacfa6167af6;
  (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scattered_dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scattered_dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scattered_dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->simplex_in_scaled_space_ = false;
  HighsSparseMatrix::HighsSparseMatrix(&this->ar_matrix_);
  HighsSparseMatrix::HighsSparseMatrix(&this->scaled_a_matrix_);
  (this->simplex_nla_).factor_.refactor_info_.pivot_type.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.refactor_info_.pivot_type.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.refactor_info_.pivot_var.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.refactor_info_.pivot_var.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 0x10) =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.refactor_info_.pivot_row.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 0x10) =
       (pointer)0x0;
  (this->simplex_nla_).factor_.refactor_info_.pivot_var.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->simplex_nla_).factor_.refactor_info_.pivot_row.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.refactor_info_.pivot_row.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.refactor_info_.pivot_type.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->simplex_nla_).factor_.a_matrix_valid = false;
  (this->simplex_nla_).factor_.use_original_HFactor_logic = false;
  (this->simplex_nla_).factor_.debug_report_ = false;
  (this->simplex_nla_).factor_.basis_matrix_limit_size = 0;
  (this->simplex_nla_).factor_.update_method = 0;
  (this->simplex_nla_).factor_.build_timer_ = (HighsTimer *)0x0;
  (this->simplex_nla_).factor_.nwork = 0;
  (this->simplex_nla_).factor_.rhs_.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.rhs_.index.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.rhs_.index.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->simplex_nla_).factor_.rhs_.array.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.rhs_.array.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.rhs_.array.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (pointer)0x0;
  (this->simplex_nla_).factor_.rhs_.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.rhs_.cwork.super__Vector_base<char,_std::allocator<char>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.rhs_.cwork.super__Vector_base<char,_std::allocator<char>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->simplex_nla_).factor_.rhs_.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.rhs_.iwork.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.rhs_.iwork.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.rhs_.packValue.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.rhs_.packValue.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.rhs_.packIndex.super__Vector_base<int,_std::allocator<int>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->simplex_nla_).factor_.rhs_.packValue.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->simplex_nla_).factor_.rhs_.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).factor_.rhs_.packIndex.super__Vector_base<int,_std::allocator<int>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  (this->simplex_nla_).factor_.rank_deficiency = 0;
  (this->simplex_nla_).factor_.build_realTick = 0.0;
  (this->simplex_nla_).factor_.build_synthetic_tick = 0.0;
  *(undefined8 *)
   ((long)&(this->simplex_nla_).factor_.var_with_no_pivot.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   1) = 0;
  *(undefined8 *)
   ((long)&(this->simplex_nla_).factor_.var_with_no_pivot.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage + 1) = 0;
  (this->simplex_nla_).factor_.var_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->simplex_nla_).factor_.var_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->simplex_nla_).factor_.col_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->simplex_nla_).factor_.col_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->simplex_nla_).factor_.row_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->simplex_nla_).factor_.col_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->simplex_nla_).factor_.row_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->simplex_nla_).factor_.row_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->simplex_nla_).factor_.kernel_num_el = 0;
  (this->simplex_nla_).factor_.num_row = 0;
  (this->simplex_nla_).factor_.num_col = 0;
  (this->simplex_nla_).factor_.num_basic = 0;
  (this->simplex_nla_).factor_.basis_matrix_num_el = 0;
  (this->simplex_nla_).factor_.invert_num_el = 0;
  (this->simplex_nla_).factor_.kernel_dim = 0;
  (this->simplex_nla_).factor_.kernel_num_el = 0;
  (this->simplex_nla_).factor_.highs_debug_level = 0;
  (this->simplex_nla_).factor_.pivot_threshold = 0.0;
  (this->simplex_nla_).factor_.pivot_tolerance = 0.0;
  (this->simplex_nla_).factor_.a_value = (double *)0x0;
  (this->simplex_nla_).factor_.basic_index = (HighsInt *)0x0;
  (this->simplex_nla_).factor_.a_start = (HighsInt *)0x0;
  (this->simplex_nla_).factor_.a_index = (HighsInt *)0x0;
  *(undefined8 *)((long)&(this->simplex_nla_).factor_.log_options.user_callback._M_invoker + 1) = 0;
  *(undefined8 *)((long)&(this->simplex_nla_).factor_.log_options.user_callback_data + 1) = 0;
  (this->simplex_nla_).factor_.log_options.user_callback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->simplex_nla_).factor_.log_options.user_callback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)
   &(this->simplex_nla_).factor_.log_options.user_callback.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->simplex_nla_).factor_.log_options.user_callback.super__Function_base._M_functor +
   8) = 0;
  (this->simplex_nla_).factor_.log_options.user_log_callback =
       (_func_void_HighsLogType_char_ptr_void_ptr *)0x0;
  (this->simplex_nla_).factor_.log_options.user_log_callback_data = (void *)0x0;
  (this->simplex_nla_).factor_.log_options.log_to_console = (bool *)0x0;
  (this->simplex_nla_).factor_.log_options.log_dev_level = (HighsInt *)0x0;
  (this->simplex_nla_).factor_.log_options.log_stream = (FILE *)0x0;
  (this->simplex_nla_).factor_.log_options.output_flag = (bool *)0x0;
  (this->simplex_nla_).factor_.time_limit_ = 0.0;
  (this->simplex_nla_).factor_.log_data._M_t.
  super___uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>._M_t.
  super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
  super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl = (LogData *)0x0;
  memset(&(this->simplex_nla_).factor_.iwork,0,0x518);
  (this->simplex_nla_).update_.valid_ = false;
  (this->simplex_nla_).simplex_iterate_.basis_.basicIndex_.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).simplex_iterate_.basis_.basicIndex_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).simplex_iterate_.basis_.basicIndex_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 0x10) =
       (pointer)0x0;
  (this->simplex_nla_).simplex_iterate_.basis_.nonbasicFlag_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).simplex_iterate_.basis_.nonbasicFlag_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).simplex_iterate_.basis_.nonbasicFlag_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->simplex_nla_).simplex_iterate_.basis_.nonbasicMove_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).simplex_iterate_.basis_.nonbasicMove_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->simplex_nla_).simplex_iterate_.basis_.nonbasicMove_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->simplex_nla_).update_.pivot_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->simplex_nla_).update_.pivot_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->simplex_nla_).update_.pivot_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->simplex_nla_).update_.pivot_value_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->simplex_nla_).update_.pivot_value_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->simplex_nla_).update_.pivot_value_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->simplex_nla_).update_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->simplex_nla_).update_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->simplex_nla_).update_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->simplex_nla_).update_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->simplex_nla_).update_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->simplex_nla_).update_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->simplex_nla_).update_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->simplex_nla_).update_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->simplex_nla_).update_.value_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->simplex_nla_).update_.value_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->simplex_nla_).simplex_iterate_.basis_.debug_id = -1;
  (this->simplex_nla_).simplex_iterate_.basis_.debug_update_count = -1;
  (this->simplex_nla_).simplex_iterate_.basis_.debug_origin_name._M_dataplus._M_p =
       (pointer)&(this->simplex_nla_).simplex_iterate_.basis_.debug_origin_name.field_2;
  (this->simplex_nla_).simplex_iterate_.basis_.debug_origin_name._M_string_length = 0;
  (this->simplex_nla_).simplex_iterate_.basis_.debug_origin_name.field_2._M_local_buf[0] = '\0';
  (this->hot_start_).refactor_info.use = false;
  (this->hot_start_).refactor_info.pivot_type.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->hot_start_).refactor_info.pivot_type.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->hot_start_).refactor_info.pivot_type.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->hot_start_).refactor_info.pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hot_start_).refactor_info.pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hot_start_).refactor_info.pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hot_start_).refactor_info.pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hot_start_).refactor_info.pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hot_start_).refactor_info.pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hot_start_).nonbasicMove.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hot_start_).nonbasicMove.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hot_start_).nonbasicMove.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  memset(&(this->simplex_nla_).simplex_iterate_.invert_,0,0x271);
  this->cost_scale_ = 1.0;
  this->cost_perturbation_base_ = 0.0;
  this->cost_perturbation_max_abs_cost_ = 0.0;
  *(undefined8 *)((long)&this->cost_perturbation_max_abs_cost_ + 4) = 0;
  this->dual_simplex_cleanup_level_ = 0;
  this->dual_simplex_phase1_cleanup_level_ = 0;
  this->previous_iteration_cycling_detected = -0x7fffffff;
  this->solve_bailout_ = false;
  this->called_return_from_solve_ = false;
  (this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->exit_algorithm_ = kNone;
  this->return_primal_solution_status_ = 0;
  *(undefined8 *)&this->return_dual_solution_status_ = 0;
  *(undefined8 *)
   ((long)&(this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->original_num_col_ = 0;
  this->original_num_row_ = 0;
  this->original_num_nz_ = 0;
  memset(&this->original_offset_,0,0xd1);
  this->debug_initial_build_synthetic_tick_ = 0;
  this->debug_solve_report_ = false;
  this->debug_iteration_report_ = false;
  this->debug_basis_report_ = false;
  this->debug_dual_feasible = false;
  this->debug_max_relative_dual_steepest_edge_weight_error = 0.0;
  (this->bad_basis_change_).
  super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bad_basis_change_).
  super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bad_basis_change_).
  super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->primal_phase1_dual_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->primal_phase1_dual_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->primal_phase1_dual_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

HEkk()
      : callback_(nullptr),
        options_(nullptr),
        timer_(nullptr),
        lp_name_(""),
        model_status_(HighsModelStatus::kNotset),
        simplex_in_scaled_space_(false),
        cost_scale_(1.0),
        cost_perturbation_base_(0.0),
        cost_perturbation_max_abs_cost_(0.0),
        iteration_count_(0),
        dual_simplex_cleanup_level_(0),
        dual_simplex_phase1_cleanup_level_(0),
        previous_iteration_cycling_detected(-kHighsIInf),
        solve_bailout_(false),
        called_return_from_solve_(false),
        exit_algorithm_(SimplexAlgorithm::kNone),
        return_primal_solution_status_(0),
        return_dual_solution_status_(0),
        original_num_col_(0),
        original_num_row_(0),
        original_num_nz_(0),
        original_offset_(0.0),
        edge_weight_error_(0.0),
        build_synthetic_tick_(0.0),
        total_synthetic_tick_(0.0),
        debug_solve_call_num_(0),
        debug_basis_id_(0),
        time_report_(false),
        debug_initial_build_synthetic_tick_(0),
        debug_solve_report_(false),
        debug_iteration_report_(false),
        debug_basis_report_(false),
        debug_dual_feasible(false),
        debug_max_relative_dual_steepest_edge_weight_error(0) {}